

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3.hpp
# Opt level: O2

bool jsoncons::detail::grisu3(double v,char *buffer,int *length,int *K)

{
  undefined1 auVar1 [12];
  bool bVar2;
  double dVar3;
  diy_fp_t dVar4;
  diy_fp_t dVar5;
  diy_fp_t dVar6;
  diy_fp_t x;
  diy_fp_t x_00;
  diy_fp_t Wm;
  diy_fp_t y;
  diy_fp_t y_00;
  diy_fp_t W;
  diy_fp_t Wp;
  diy_fp_t w_m;
  diy_fp_t w_p;
  
  normalized_boundaries(v,&w_m,&w_p);
  dVar4 = double2diy_fp(v);
  dVar5._8_8_ = dVar4._8_8_;
  dVar5.f = (ulong)(uint)dVar4.e;
  dVar4 = normalize_diy_fp((detail *)dVar4.f,dVar5);
  dVar3 = ceil((double)(-0x3c - w_p.e) * 0.30102999566398114);
  dVar5 = cached_power((int)dVar3);
  dVar6._12_4_ = 0;
  dVar6.f = SUB128(dVar4._0_12_,0);
  dVar6.e = SUB124(dVar4._0_12_,8);
  auVar1 = dVar5._0_12_;
  dVar4._12_4_ = 0;
  dVar4.f = auVar1._0_8_;
  dVar4.e = auVar1._8_4_;
  dVar4 = multiply(dVar6,dVar4);
  x.e = w_p.e;
  x.f = w_p.f;
  x._12_4_ = 0;
  y._12_4_ = 0;
  y.f = auVar1._0_8_;
  y.e = auVar1._8_4_;
  dVar5 = multiply(x,y);
  x_00._12_4_ = 0;
  x_00.f = w_m.f;
  x_00.e = w_m.e;
  y_00._12_4_ = 0;
  y_00.f = auVar1._0_8_;
  y_00.e = auVar1._8_4_;
  dVar6 = multiply(x_00,y_00);
  *K = -(int)dVar3;
  Wm._12_4_ = 0;
  Wm.f = SUB128(dVar6._0_12_,0);
  Wm.e = SUB124(dVar6._0_12_,8);
  W._12_4_ = 0;
  W.f = SUB128(dVar4._0_12_,0);
  W.e = SUB124(dVar4._0_12_,8);
  Wp._12_4_ = 0;
  Wp.f = SUB128(dVar5._0_12_,0);
  Wp.e = SUB124(dVar5._0_12_,8);
  bVar2 = digit_gen(Wm,W,Wp,buffer,length,K);
  buffer[*length] = '\0';
  return bVar2;
}

Assistant:

inline
bool grisu3(double v, char *buffer, int *length, int *K)
{
    diy_fp_t w_m, w_p;
    int q = 64, alpha = -59, gamma = -56;
    normalized_boundaries(v, &w_m, &w_p);
    diy_fp_t w = normalize_diy_fp(double2diy_fp(v));
    int mk = k_comp(w_p.e + q, alpha, gamma);
    diy_fp_t c_mk = cached_power(mk);
    diy_fp_t W  = multiply(w,   c_mk);
    diy_fp_t Wp = multiply(w_p, c_mk);
    diy_fp_t Wm = multiply(w_m, c_mk);
    *K = -mk;
    bool result = digit_gen(Wm, W, Wp, buffer, length, K);
    buffer[*length] = 0;
    return result;
}